

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall QDate::addYears(QDate *this,int nyears,QCalendar cal)

{
  bool bVar1;
  uint uVar2;
  QDate QVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  YearMonthDay YVar5;
  QCalendar local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.jd = -0x8000000000000000;
  local_38.d_ptr = cal.d_ptr;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar5 = QCalendar::partsFromDate(&local_38,(QDate)this->jd);
    uVar4 = YVar5._0_8_ & 0xffffffff00000000;
    if (uVar4 != 0x8000000000000000) {
      uVar2 = nyears + YVar5.year;
      bVar1 = QCalendar::hasYearZero(&local_38);
      if (!bVar1) {
        if ((uVar2 == 0) || (0 < YVar5.year == (int)uVar2 < 1)) {
          uVar2 = (uVar2 + (uint)(0 < nyears) * 2) - 1;
        }
      }
      uVar4 = uVar4 | uVar2;
      YVar5.day = YVar5.day;
      YVar5.year = (int)uVar4;
      YVar5.month = (int)(uVar4 >> 0x20);
      QVar3 = fixedDate(YVar5,local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDate)QVar3.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::addYears(int nyears, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    auto parts = cal.partsFromDate(*this);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if (!cal.hasYearZero() && ((old_y > 0) != (parts.year > 0) || !parts.year))
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts, cal);
}